

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O3

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ofstream file;
  path local_278;
  path local_250;
  undefined1 local_228 [248];
  ios_base local_130 [264];
  
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n,
             auto_format);
  std::filesystem::__cxx11::operator/(&local_278,&this->output_path,&local_250);
  ::std::ofstream::ofstream(local_228,local_278._M_pathname._M_dataplus._M_p,_S_out);
  std::filesystem::__cxx11::path::~path(&local_278);
  std::filesystem::__cxx11::path::~path(&local_250);
  render_file(&local_278._M_pathname,this,(path *)CONCAT44(in_register_00000034,__fd),(json *)__buf)
  ;
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_228,local_278._M_pathname._M_dataplus._M_p,
             local_278._M_pathname._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_pathname._M_dataplus._M_p != &local_278._M_pathname.field_2) {
    operator_delete(local_278._M_pathname._M_dataplus._M_p,
                    local_278._M_pathname.field_2._M_allocated_capacity + 1);
  }
  ::std::ofstream::close();
  local_228._0_8_ = _VTT;
  *(undefined8 *)(local_228 + (long)_VTT[-3]) = _strtod;
  ::std::filebuf::~filebuf((filebuf *)(local_228 + 8));
  sVar1 = ::std::ios_base::~ios_base(local_130);
  return sVar1;
}

Assistant:

void write(const std::filesystem::path& filename, const json& data, const std::string& filename_out) {
    std::ofstream file(output_path / filename_out);
    file << render_file(filename, data);
    file.close();
  }